

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

cmGlobalGenerator * __thiscall cmake::CreateGlobalGenerator(cmake *this,string *gname)

{
  bool bVar1;
  int iVar2;
  reference ppcVar3;
  undefined4 extraout_var;
  cmGlobalGeneratorFactory *g;
  iterator __end1;
  iterator __begin1;
  RegisteredGeneratorsVector *__range1;
  cmGlobalGenerator *generator;
  string local_68 [8];
  string name;
  cmExternalMakefileProjectGenerator *extraGenerator;
  pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extra;
  string *gname_local;
  cmake *this_local;
  
  extra.second.field_2._8_8_ = gname;
  createExtraGenerator
            ((pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&extraGenerator,&this->ExtraGenerators,gname);
  name.field_2._8_8_ = extraGenerator;
  std::__cxx11::string::string(local_68,(string *)&extra);
  __range1 = (RegisteredGeneratorsVector *)0x0;
  __end1 = std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::
           begin(&this->Generators);
  g = (cmGlobalGeneratorFactory *)
      std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::end
                (&this->Generators);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
                                     *)&g), bVar1) {
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
              ::operator*(&__end1);
    iVar2 = (*(*ppcVar3)->_vptr_cmGlobalGeneratorFactory[2])(*ppcVar3,local_68,this);
    __range1 = (RegisteredGeneratorsVector *)CONCAT44(extraout_var,iVar2);
    if (__range1 != (RegisteredGeneratorsVector *)0x0) break;
    __gnu_cxx::
    __normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
    ::operator++(&__end1);
  }
  if (__range1 == (RegisteredGeneratorsVector *)0x0) {
    if (name.field_2._8_8_ != 0) {
      (**(code **)(*(long *)name.field_2._8_8_ + 8))();
    }
  }
  else {
    cmGlobalGenerator::SetExternalMakefileProjectGenerator
              ((cmGlobalGenerator *)__range1,
               (cmExternalMakefileProjectGenerator *)name.field_2._8_8_);
  }
  std::__cxx11::string::~string(local_68);
  std::
  pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&extraGenerator);
  return (cmGlobalGenerator *)__range1;
}

Assistant:

cmGlobalGenerator* cmake::CreateGlobalGenerator(const std::string& gname)
{
  std::pair<cmExternalMakefileProjectGenerator*, std::string> extra =
    createExtraGenerator(this->ExtraGenerators, gname);
  cmExternalMakefileProjectGenerator* extraGenerator = extra.first;
  const std::string name = extra.second;

  cmGlobalGenerator* generator = nullptr;
  for (cmGlobalGeneratorFactory* g : this->Generators) {
    generator = g->CreateGlobalGenerator(name, this);
    if (generator) {
      break;
    }
  }

  if (generator) {
    generator->SetExternalMakefileProjectGenerator(extraGenerator);
  } else {
    delete extraGenerator;
  }

  return generator;
}